

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_padlock.c
# Opt level: O0

int padlock_bind_helper(ENGINE *e)

{
  int iVar1;
  ENGINE *in_RDI;
  char *pcVar2;
  int local_4;
  
  padlock_available();
  padlock_use_rng = 0;
  pcVar2 = "no-ACE";
  if (padlock_use_ace != 0) {
    pcVar2 = "ACE";
  }
  BIO_snprintf(padlock_name,100,"VIA PadLock (%s, %s)","no-RNG",pcVar2);
  iVar1 = ENGINE_set_id(in_RDI,padlock_id);
  if ((((iVar1 == 0) || (iVar1 = ENGINE_set_name(in_RDI,padlock_name), iVar1 == 0)) ||
      (iVar1 = ENGINE_set_init_function(in_RDI,padlock_init), iVar1 == 0)) ||
     (((padlock_use_ace != 0 && (iVar1 = ENGINE_set_ciphers(in_RDI,padlock_ciphers), iVar1 == 0)) ||
      ((padlock_use_rng != 0 &&
       (iVar1 = ENGINE_set_RAND(in_RDI,(RAND_METHOD *)&padlock_rand), iVar1 == 0)))))) {
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int padlock_bind_helper(ENGINE *e)
{
    /* Check available features */
    padlock_available();

    /*
     * RNG is currently disabled for reasons discussed in commentary just
     * before padlock_rand_bytes function.
     */
    padlock_use_rng = 0;

    /* Generate a nice engine name with available features */
    BIO_snprintf(padlock_name, sizeof(padlock_name),
                 "VIA PadLock (%s, %s)",
                 padlock_use_rng ? "RNG" : "no-RNG",
                 padlock_use_ace ? "ACE" : "no-ACE");

    /* Register everything or return with an error */
    if (!ENGINE_set_id(e, padlock_id) ||
        !ENGINE_set_name(e, padlock_name) ||
        !ENGINE_set_init_function(e, padlock_init) ||
        (padlock_use_ace && !ENGINE_set_ciphers(e, padlock_ciphers)) ||
        (padlock_use_rng && !ENGINE_set_RAND(e, &padlock_rand))) {
        return 0;
    }

    /* Everything looks good */
    return 1;
}